

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cascade.cpp
# Opt level: O0

vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> * __thiscall
Iir::Cascade::getPoleZeros(Cascade *this)

{
  int *in_RSI;
  value_type *in_RDI;
  BiquadPoleState bps;
  int i;
  Biquad *stage;
  vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> *vpz;
  value_type *__x;
  vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff98;
  vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> *in_stack_ffffffffffffffa0;
  undefined4 local_34;
  
  __x = in_RDI;
  std::vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>::vector
            ((vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> *)0x103ecd);
  std::vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>::reserve
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_34 = *in_RSI;
  while (local_34 = local_34 + -1, -1 < local_34) {
    BiquadPoleState::BiquadPoleState((BiquadPoleState *)vpz,(Biquad *)this);
    std::vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>::push_back
              (in_stack_ffffffffffffff80,__x);
  }
  return (vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> *)in_RDI;
}

Assistant:

std::vector<PoleZeroPair> Cascade::getPoleZeros () const
	{
		std::vector<PoleZeroPair> vpz;
		vpz.reserve ((unsigned long)m_numStages);

		const Biquad* stage = m_stageArray;
		for (int i = m_numStages; --i >=0;)
		{
			BiquadPoleState bps (*stage++);
			vpz.push_back (bps);
		}

		return vpz;
	}